

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int rtreeSqlInit(Rtree *pRtree,sqlite3 *db,char *zDb,char *zPrefix,int isCreate)

{
  uint uVar1;
  sqlite3_stmt *pStmt;
  int iVar2;
  int iVar3;
  sqlite3_str *psVar4;
  char *pcVar5;
  Mem *pMem;
  uint uVar6;
  i64 iVar7;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  int *piVar11;
  long in_FS_OFFSET;
  bool bVar12;
  sqlite3_stmt *p;
  sqlite3_stmt **appStmt [8];
  sqlite3_stmt *local_80;
  sqlite3_stmt **local_78 [8];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_78[6] = (sqlite3_stmt **)&DAT_aaaaaaaaaaaaaaaa;
  local_78[7] = (sqlite3_stmt **)&DAT_aaaaaaaaaaaaaaaa;
  local_78[4] = (sqlite3_stmt **)&DAT_aaaaaaaaaaaaaaaa;
  local_78[5] = (sqlite3_stmt **)&DAT_aaaaaaaaaaaaaaaa;
  local_78[2] = (sqlite3_stmt **)&DAT_aaaaaaaaaaaaaaaa;
  local_78[3] = (sqlite3_stmt **)&DAT_aaaaaaaaaaaaaaaa;
  local_78[0] = (sqlite3_stmt **)&DAT_aaaaaaaaaaaaaaaa;
  local_78[1] = (sqlite3_stmt **)&DAT_aaaaaaaaaaaaaaaa;
  pRtree->db = db;
  if (isCreate == 0) {
LAB_001f9e58:
    local_78[0] = &pRtree->pWriteNode;
    local_78[1] = &pRtree->pDeleteNode;
    local_78[2] = &pRtree->pReadRowid;
    local_78[3] = &pRtree->pWriteRowid;
    local_78[4] = &pRtree->pDeleteRowid;
    local_78[5] = &pRtree->pReadParent;
    local_78[6] = &pRtree->pWriteParent;
    local_78[7] = &pRtree->pDeleteParent;
    local_80 = (sqlite3_stmt *)&DAT_aaaaaaaaaaaaaaaa;
    iVar3 = sqlite3_table_column_metadata
                      (db,pRtree->zDb,"sqlite_stat1",(char *)0x0,(char **)0x0,(char **)0x0,
                       (int *)0x0,(int *)0x0,(int *)0x0);
    if (iVar3 == 0) {
      pcVar5 = sqlite3_mprintf("SELECT stat FROM %Q.sqlite_stat1 WHERE tbl = \'%q_rowid\'",
                               pRtree->zDb,pRtree->zName);
      if (pcVar5 == (char *)0x0) {
        iVar2 = 7;
        iVar7 = 100;
      }
      else {
        iVar2 = sqlite3LockAndPrepare(db,pcVar5,-1,0x80,(Vdbe *)0x0,&local_80,(char **)0x0);
        pStmt = local_80;
        if (iVar2 == 0) {
          iVar2 = sqlite3_step(local_80);
          iVar7 = 100;
          if (iVar2 == 100) {
            pMem = columnMem(pStmt,0);
            iVar7 = sqlite3VdbeIntValue(pMem);
            columnMallocFailure(pStmt);
          }
          iVar2 = sqlite3_finalize(pStmt);
        }
        else {
          iVar7 = 100;
        }
        sqlite3_free(pcVar5);
      }
      lVar10 = 100;
      if (100 < iVar7) {
        lVar10 = iVar7;
      }
      pRtree->nRowEst = lVar10;
    }
    else {
      pRtree->nRowEst = 0x100000;
      iVar2 = 0;
      if (iVar3 != 1) {
        iVar2 = iVar3;
      }
    }
    if (iVar2 == 0) {
      piVar11 = &rtreeSqlInit_azSql_rel;
      uVar8 = 0;
      do {
        if ((uVar8 != 3) ||
           (pcVar5 = 
            "INSERT INTO\"%w\".\"%w_rowid\"(rowid,nodeno)VALUES(?1,?2)ON CONFLICT(rowid)DO UPDATE SET nodeno=excluded.nodeno"
           , pRtree->nAux == '\0')) {
          pcVar5 = (char *)((long)&rtreeSqlInit_azSql_rel + (long)*piVar11);
        }
        pcVar5 = sqlite3_mprintf(pcVar5,zDb,zPrefix);
        if (pcVar5 == (char *)0x0) {
          iVar2 = 7;
        }
        else {
          iVar2 = sqlite3LockAndPrepare(db,pcVar5,-1,0x85,(Vdbe *)0x0,local_78[uVar8],(char **)0x0);
        }
        sqlite3_free(pcVar5);
        if (6 < uVar8) break;
        uVar8 = uVar8 + 1;
        piVar11 = piVar11 + 1;
      } while (iVar2 == 0);
    }
    if ((pRtree->nAux != '\0') && (iVar2 != 7)) {
      pcVar5 = sqlite3_mprintf("SELECT * FROM \"%w\".\"%w_rowid\" WHERE rowid=?1",zDb,zPrefix);
      pRtree->zReadAuxSql = pcVar5;
      iVar2 = 7;
      if (pcVar5 != (char *)0x0) {
        psVar4 = sqlite3_str_new(db);
        sqlite3_str_appendf(psVar4,"UPDATE \"%w\".\"%w_rowid\"SET ",zDb,zPrefix);
        if (pRtree->nAux != '\0') {
          uVar9 = 0;
          do {
            if (uVar9 != 0) {
              uVar1 = psVar4->nChar;
              uVar6 = uVar1 + 1;
              if (uVar6 < psVar4->nAlloc) {
                psVar4->nChar = uVar6;
                psVar4->zText[uVar1] = ',';
              }
              else {
                enlargeAndAppend(psVar4,",",1);
              }
            }
            if (uVar9 < pRtree->nAuxNotNull) {
              sqlite3_str_appendf(psVar4,"a%d=coalesce(?%d,a%d)",(ulong)uVar9,(ulong)(uVar9 + 2));
            }
            else {
              sqlite3_str_appendf(psVar4,"a%d=?%d",(ulong)uVar9,(ulong)(uVar9 + 2));
            }
            uVar9 = uVar9 + 1;
          } while (uVar9 < pRtree->nAux);
        }
        sqlite3_str_appendf(psVar4," WHERE rowid=?1");
        pcVar5 = sqlite3_str_finish(psVar4);
        if (pcVar5 != (char *)0x0) {
          iVar2 = sqlite3LockAndPrepare
                            (db,pcVar5,-1,0x85,(Vdbe *)0x0,&pRtree->pWriteAux,(char **)0x0);
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            sqlite3_free(pcVar5);
            return iVar2;
          }
          goto LAB_001fa1ff;
        }
      }
    }
  }
  else {
    psVar4 = sqlite3_str_new(db);
    sqlite3_str_appendf(psVar4,"CREATE TABLE \"%w\".\"%w_rowid\"(rowid INTEGER PRIMARY KEY,nodeno",
                        zDb,zPrefix);
    if (pRtree->nAux != '\0') {
      uVar8 = 0;
      do {
        sqlite3_str_appendf(psVar4,",a%d",uVar8);
        uVar9 = (int)uVar8 + 1;
        uVar8 = (ulong)uVar9;
      } while (uVar9 < pRtree->nAux);
    }
    bVar12 = false;
    sqlite3_str_appendf(psVar4,");CREATE TABLE \"%w\".\"%w_node\"(nodeno INTEGER PRIMARY KEY,data);"
                        ,zDb,zPrefix);
    sqlite3_str_appendf(psVar4,
                        "CREATE TABLE \"%w\".\"%w_parent\"(nodeno INTEGER PRIMARY KEY,parentnode);",
                        zDb,zPrefix);
    sqlite3_str_appendf(psVar4,"INSERT INTO \"%w\".\"%w_node\"VALUES(1,zeroblob(%d))",zDb);
    pcVar5 = sqlite3_str_finish(psVar4);
    if (pcVar5 == (char *)0x0) {
      iVar2 = 7;
    }
    else {
      iVar2 = sqlite3_exec(db,pcVar5,(sqlite3_callback)0x0,(void *)0x0,(char **)0x0);
      sqlite3_free(pcVar5);
      bVar12 = iVar2 == 0;
    }
    if (bVar12) goto LAB_001f9e58;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar2;
  }
LAB_001fa1ff:
  __stack_chk_fail();
}

Assistant:

static int rtreeSqlInit(
  Rtree *pRtree,
  sqlite3 *db,
  const char *zDb,
  const char *zPrefix,
  int isCreate
){
  int rc = SQLITE_OK;

  #define N_STATEMENT 8
  static const char *azSql[N_STATEMENT] = {
    /* Write the xxx_node table */
    "INSERT OR REPLACE INTO '%q'.'%q_node' VALUES(?1, ?2)",
    "DELETE FROM '%q'.'%q_node' WHERE nodeno = ?1",

    /* Read and write the xxx_rowid table */
    "SELECT nodeno FROM '%q'.'%q_rowid' WHERE rowid = ?1",
    "INSERT OR REPLACE INTO '%q'.'%q_rowid' VALUES(?1, ?2)",
    "DELETE FROM '%q'.'%q_rowid' WHERE rowid = ?1",

    /* Read and write the xxx_parent table */
    "SELECT parentnode FROM '%q'.'%q_parent' WHERE nodeno = ?1",
    "INSERT OR REPLACE INTO '%q'.'%q_parent' VALUES(?1, ?2)",
    "DELETE FROM '%q'.'%q_parent' WHERE nodeno = ?1"
  };
  sqlite3_stmt **appStmt[N_STATEMENT];
  int i;
  const int f = SQLITE_PREPARE_PERSISTENT|SQLITE_PREPARE_NO_VTAB;

  pRtree->db = db;

  if( isCreate ){
    char *zCreate;
    sqlite3_str *p = sqlite3_str_new(db);
    int ii;
    sqlite3_str_appendf(p,
       "CREATE TABLE \"%w\".\"%w_rowid\"(rowid INTEGER PRIMARY KEY,nodeno",
       zDb, zPrefix);
    for(ii=0; ii<pRtree->nAux; ii++){
      sqlite3_str_appendf(p,",a%d",ii);
    }
    sqlite3_str_appendf(p,
      ");CREATE TABLE \"%w\".\"%w_node\"(nodeno INTEGER PRIMARY KEY,data);",
      zDb, zPrefix);
    sqlite3_str_appendf(p,
    "CREATE TABLE \"%w\".\"%w_parent\"(nodeno INTEGER PRIMARY KEY,parentnode);",
      zDb, zPrefix);
    sqlite3_str_appendf(p,
       "INSERT INTO \"%w\".\"%w_node\"VALUES(1,zeroblob(%d))",
       zDb, zPrefix, pRtree->iNodeSize);
    zCreate = sqlite3_str_finish(p);
    if( !zCreate ){
      return SQLITE_NOMEM;
    }
    rc = sqlite3_exec(db, zCreate, 0, 0, 0);
    sqlite3_free(zCreate);
    if( rc!=SQLITE_OK ){
      return rc;
    }
  }

  appStmt[0] = &pRtree->pWriteNode;
  appStmt[1] = &pRtree->pDeleteNode;
  appStmt[2] = &pRtree->pReadRowid;
  appStmt[3] = &pRtree->pWriteRowid;
  appStmt[4] = &pRtree->pDeleteRowid;
  appStmt[5] = &pRtree->pReadParent;
  appStmt[6] = &pRtree->pWriteParent;
  appStmt[7] = &pRtree->pDeleteParent;

  rc = rtreeQueryStat1(db, pRtree);
  for(i=0; i<N_STATEMENT && rc==SQLITE_OK; i++){
    char *zSql;
    const char *zFormat;
    if( i!=3 || pRtree->nAux==0 ){
       zFormat = azSql[i];
    }else {
       /* An UPSERT is very slightly slower than REPLACE, but it is needed
       ** if there are auxiliary columns */
       zFormat = "INSERT INTO\"%w\".\"%w_rowid\"(rowid,nodeno)VALUES(?1,?2)"
                  "ON CONFLICT(rowid)DO UPDATE SET nodeno=excluded.nodeno";
    }
    zSql = sqlite3_mprintf(zFormat, zDb, zPrefix);
    if( zSql ){
      rc = sqlite3_prepare_v3(db, zSql, -1, f, appStmt[i], 0);
    }else{
      rc = SQLITE_NOMEM;
    }
    sqlite3_free(zSql);
  }
  if( pRtree->nAux && rc!=SQLITE_NOMEM ){
    pRtree->zReadAuxSql = sqlite3_mprintf(
       "SELECT * FROM \"%w\".\"%w_rowid\" WHERE rowid=?1",
       zDb, zPrefix);
    if( pRtree->zReadAuxSql==0 ){
      rc = SQLITE_NOMEM;
    }else{
      sqlite3_str *p = sqlite3_str_new(db);
      int ii;
      char *zSql;
      sqlite3_str_appendf(p, "UPDATE \"%w\".\"%w_rowid\"SET ", zDb, zPrefix);
      for(ii=0; ii<pRtree->nAux; ii++){
        if( ii ) sqlite3_str_append(p, ",", 1);
#ifdef SQLITE_ENABLE_GEOPOLY
        if( ii<pRtree->nAuxNotNull ){
          sqlite3_str_appendf(p,"a%d=coalesce(?%d,a%d)",ii,ii+2,ii);
        }else
#endif
        {
          sqlite3_str_appendf(p,"a%d=?%d",ii,ii+2);
        }
      }
      sqlite3_str_appendf(p, " WHERE rowid=?1");
      zSql = sqlite3_str_finish(p);
      if( zSql==0 ){
        rc = SQLITE_NOMEM;
      }else{
        rc = sqlite3_prepare_v3(db, zSql, -1, f, &pRtree->pWriteAux, 0);
        sqlite3_free(zSql);
      }
    }
  }

  return rc;
}